

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O3

void google::InternalStringPrintf(string *output,char *format,__va_list_tag *ap)

{
  uint uVar1;
  uint uVar2;
  char *__s;
  ulong __maxlen;
  va_list backup_ap;
  char space [128];
  undefined8 local_d8;
  void *pvStack_d0;
  void *local_c8;
  char local_b8 [136];
  
  local_c8 = ap->reg_save_area;
  local_d8._0_4_ = ap->gp_offset;
  local_d8._4_4_ = ap->fp_offset;
  pvStack_d0 = ap->overflow_arg_area;
  uVar2 = vsnprintf(local_b8,0x80,format,&local_d8);
  if (uVar2 < 0x80) {
    std::__cxx11::string::append((char *)output,(ulong)local_b8);
  }
  else {
    __maxlen = 0x80;
    while( true ) {
      uVar1 = uVar2 + 1;
      if ((int)uVar2 < 0) {
        uVar1 = (int)__maxlen * 2;
      }
      __maxlen = (ulong)uVar1;
      __s = (char *)operator_new__(__maxlen);
      local_d8._0_4_ = ap->gp_offset;
      local_d8._4_4_ = ap->fp_offset;
      pvStack_d0 = ap->overflow_arg_area;
      local_c8 = ap->reg_save_area;
      uVar2 = vsnprintf(__s,__maxlen,format,&local_d8);
      if ((int)uVar2 < (int)uVar1 && -1 < (int)uVar2) break;
      operator_delete__(__s);
    }
    std::__cxx11::string::append((char *)output,(ulong)__s);
    operator_delete__(__s);
  }
  return;
}

Assistant:

inline void InternalStringPrintf(std::string* output, const char* format,
                                 va_list ap) {
  char space[128];    // try a small buffer and hope it fits

  // It's possible for methods that use a va_list to invalidate
  // the data in it upon use.  The fix is to make a copy
  // of the structure before using it and use that copy instead.
  va_list backup_ap;
  va_copy(backup_ap, ap);
  int bytes_written = vsnprintf(space, sizeof(space), format, backup_ap);
  va_end(backup_ap);

  if ((bytes_written >= 0) && (static_cast<size_t>(bytes_written) < sizeof(space))) {
    output->append(space, bytes_written);
    return;
  }

  // Repeatedly increase buffer size until it fits.
  int length = sizeof(space);
  while (true) {
    if (bytes_written < 0) {
      // Older snprintf() behavior. :-(  Just try doubling the buffer size
      length *= 2;
    } else {
      // We need exactly "bytes_written+1" characters
      length = bytes_written+1;
    }
    char* buf = new char[length];

    // Restore the va_list before we use it again
    va_copy(backup_ap, ap);
    bytes_written = vsnprintf(buf, length, format, backup_ap);
    va_end(backup_ap);

    if ((bytes_written >= 0) && (bytes_written < length)) {
      output->append(buf, bytes_written);
      delete[] buf;
      return;
    }
    delete[] buf;
  }
}